

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * __thiscall
lest::make_tuple_string<std::tuple<char,int,double,char_const*>,1ul>::make_abi_cxx11_
          (string *__return_storage_ptr__,
          make_tuple_string<std::tuple<char,int,double,char_const*>,1ul> *this,
          tuple<char,_int,_double,_const_char_*> *tuple)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  char *chr;
  tuple<char,_int,_double,_const_char_*> *extraout_RDX;
  tuple<char,_int,_double,_const_char_*> *extraout_RDX_00;
  tuple<char,_int,_double,_const_char_*> *ptVar6;
  undefined8 uVar7;
  ulong uVar8;
  ostringstream os;
  string local_1f0;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  string local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  to_string_abi_cxx11_(&local_1f0,(lest *)(this + 0x14),chr);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  paVar2 = &local_1f0.field_2;
  ptVar6 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0._M_dataplus._M_p);
    ptVar6 = extraout_RDX_00;
  }
  make_tuple_string<std::tuple<char,int,double,char_const*>,0ul>::make_abi_cxx11_
            (&local_1b0,(make_tuple_string<std::tuple<char,int,double,char_const*>,0ul> *)this,
             ptVar6);
  std::__cxx11::ostringstream::str();
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    uVar7 = local_1b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_1c8 + local_1b0._M_string_length) {
    uVar8 = 0xf;
    if (local_1d0 != local_1c0) {
      uVar8 = local_1c0[0];
    }
    if (local_1c8 + local_1b0._M_string_length <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_1b0._M_dataplus._M_p);
      goto LAB_001dcd42;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_1d0);
LAB_001dcd42:
  puVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_1f0.field_2._M_allocated_capacity = *puVar1;
    local_1f0.field_2._8_8_ = puVar5[3];
    local_1f0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *puVar1;
    local_1f0._M_dataplus._M_p = (pointer)*puVar5;
  }
  sVar3 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p == paVar2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_1f0.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1f0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1f0._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_1f0.field_2._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = sVar3;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_allocated_capacity =
       local_1f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1f0._M_dataplus._M_p = (pointer)paVar2;
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string make( TU const & tuple )
    {
        std::ostringstream os;
        os << to_string( std::get<N - 1>( tuple ) ) << ( N < std::tuple_size<TU>::value ? ", ": " ");
        return make_tuple_string<TU, N - 1>::make( tuple ) + os.str();
    }